

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

void __thiscall
cmOSXBundleGenerator::cmOSXBundleGenerator
          (cmOSXBundleGenerator *this,cmGeneratorTarget *target,string *configName)

{
  cmMakefile *pcVar1;
  cmLocalGenerator *pcVar2;
  string *configName_local;
  cmGeneratorTarget *target_local;
  cmOSXBundleGenerator *this_local;
  
  this->GT = target;
  pcVar1 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar1;
  pcVar2 = cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar2;
  std::__cxx11::string::string((string *)&this->ConfigName,(string *)configName);
  this->MacContentFolders =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  MustSkip(this);
  return;
}

Assistant:

cmOSXBundleGenerator::
cmOSXBundleGenerator(cmGeneratorTarget* target,
                     const std::string& configName)
 : GT(target)
 , Makefile(target->Target->GetMakefile())
 , LocalGenerator(target->GetLocalGenerator())
 , ConfigName(configName)
 , MacContentFolders(0)
{
  if (this->MustSkip())
    return;

}